

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

void merge_lcp_2way_unstable<true>
               (uchar **from0,lcp_t *lcp_input0,size_t n0,uchar **from1,lcp_t *lcp_input1,size_t n1,
               uchar **result,lcp_t *lcp_result)

{
  undefined8 *puVar1;
  uchar *puVar2;
  lcp_t lVar3;
  int iVar4;
  ostream *poVar5;
  size_t sVar6;
  lcp_t *plVar7;
  lcp_t *plVar8;
  long lVar9;
  char *pcVar10;
  uchar **__dest;
  lcp_t *plVar11;
  uchar **ppuVar12;
  bool bVar13;
  lcp_t *local_a0;
  lcp_t local_98;
  size_t local_88;
  lcp_t *local_80;
  uchar **local_78;
  lcp_t local_70;
  uchar **local_60;
  uchar local_48;
  undefined7 uStack_47;
  int local_40;
  uchar **local_38;
  
  local_80 = lcp_result;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"merge_lcp_2way_unstable",0x17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(): n0=",7);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", n1=",5);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  local_48 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_48,1);
  check_input(from0,lcp_input0,n0);
  check_input(from1,lcp_input1,n1);
  compare(&local_48,*from0,(size_t)*from1);
  local_98 = CONCAT71(uStack_47,local_48);
  if (local_40 < 1) {
    local_78 = from0 + 1;
    *result = *from0;
    __dest = result + 1;
    local_a0 = lcp_input0 + 1;
    local_88 = n0 - 1;
    lVar3 = *lcp_input0;
    local_70 = local_98;
  }
  else {
    *result = *from1;
    __dest = result + 1;
    local_a0 = lcp_input0;
    local_88 = n0;
    local_78 = from0;
    if (n1 - 1 == 0) {
LAB_0024098d:
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      local_48 = '~';
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_48,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"merge_lcp_2way_unstable",0x17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(): n0=",7);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", n1=",5);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      local_48 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_48,1);
      if (local_88 == 0) {
        return;
      }
      sVar6 = local_88 << 3;
      memmove(__dest,local_78,sVar6);
      *local_80 = local_98;
      plVar11 = local_80;
      goto LAB_00240a56;
    }
    local_70 = *lcp_input1;
    lcp_input1 = lcp_input1 + 1;
    n1 = n1 - 1;
    from1 = from1 + 1;
    lVar3 = local_98;
  }
LAB_00240419:
  do {
    local_98 = lVar3;
    ppuVar12 = from1;
    plVar11 = lcp_result;
    plVar7 = lcp_input1;
    lVar9 = 0;
    plVar8 = plVar11;
    local_60 = __dest;
    local_38 = __dest;
    while( true ) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Starting loop, n0=",0x12);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", n1=",5);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ...\n",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tprev  = \'",10);
      pcVar10 = *(char **)((long)__dest + lVar9 + -8);
      iVar4 = (int)poVar5;
      if (pcVar10 == (char *)0x0) {
        std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
      }
      else {
        sVar6 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar10,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tfrom0 = \'",10);
      puVar2 = *local_78;
      if (puVar2 == (uchar *)0x0) {
        std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
      }
      else {
        sVar6 = strlen((char *)puVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)puVar2,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tfrom1 = \'",10);
      pcVar10 = *(char **)((long)ppuVar12 + lVar9);
      if (pcVar10 == (char *)0x0) {
        std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
      }
      else {
        sVar6 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar10,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tlcp0  = ",9);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tlcp1  = ",9);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      __dest = local_38;
      check_lcps(*(uchar **)((long)local_38 + lVar9 + -8),*local_78,local_98,
                 *(uchar **)((long)ppuVar12 + lVar9),local_70);
      if (local_70 < local_98) {
        puVar2 = *local_78;
        if (puVar2 == (uchar *)0x0) goto LAB_00240bca;
        if (*(char **)((long)ppuVar12 + lVar9) == (char *)0x0) goto LAB_00240be9;
        iVar4 = strcmp((char *)puVar2,*(char **)((long)ppuVar12 + lVar9));
        if (-1 < iVar4) {
          __assert_fail("cmp(*from0, *from1) < 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x64f,
                        "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = true]"
                       );
        }
        local_78 = local_78 + 1;
        puVar1 = (undefined8 *)((long)__dest + lVar9);
        __dest = (uchar **)(puVar1 + 1);
        *puVar1 = puVar2;
        lcp_result = (lcp_t *)((long)plVar11 + lVar9 + 8);
        lcp_result[-1] = local_98;
        lVar3 = *local_a0;
        local_a0 = local_a0 + 1;
        local_88 = local_88 - 1;
        lcp_input1 = (lcp_t *)(lVar9 + (long)plVar7);
        from1 = (uchar **)((long)ppuVar12 + lVar9);
        if (local_88 != 0) goto LAB_00240419;
        goto LAB_00240a79;
      }
      if (local_70 <= local_98) break;
      if (*local_78 == (uchar *)0x0) goto LAB_00240bca;
      pcVar10 = *(char **)((long)ppuVar12 + lVar9);
      if (pcVar10 == (char *)0x0) goto LAB_00240be9;
      iVar4 = strcmp((char *)*local_78,pcVar10);
      if (iVar4 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x655,
                      "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = true]"
                     );
      }
      local_60 = local_60 + 1;
      *(char **)((long)__dest + lVar9) = pcVar10;
      plVar8 = plVar8 + 1;
      *(lcp_t *)((long)plVar11 + lVar9) = local_70;
      local_70 = *(ulong *)((long)plVar7 + lVar9);
      lVar9 = lVar9 + 8;
      n1 = n1 - 1;
      if (n1 == 0) {
        __dest = (uchar **)((long)__dest + lVar9);
        local_80 = (lcp_t *)((long)plVar11 + lVar9);
        goto LAB_0024098d;
      }
    }
    compare(&local_48,*local_78,*(size_t *)((long)ppuVar12 + lVar9));
    local_70 = CONCAT71(uStack_47,local_48);
    if (local_40 < 0) {
      *(uchar **)((long)__dest + lVar9) = *local_78;
      *(lcp_t *)((long)plVar11 + lVar9) = local_98;
      local_88 = local_88 - 1;
      if (local_88 == 0) break;
      __dest = (uchar **)((long)__dest + lVar9 + 8);
      local_78 = local_78 + 1;
      lVar3 = *local_a0;
      local_a0 = local_a0 + 1;
      lcp_input1 = (lcp_t *)((long)plVar7 + lVar9);
      lcp_result = (lcp_t *)((long)plVar11 + lVar9 + 8);
      from1 = (uchar **)((long)ppuVar12 + lVar9);
      goto LAB_00240419;
    }
    if (local_40 == 0) {
      puVar2 = *local_78;
      if (puVar2 == (uchar *)0x0) {
LAB_00240bca:
        __assert_fail("a != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x51,"int cmp(const unsigned char *, const unsigned char *)");
      }
      if (*(char **)((long)ppuVar12 + lVar9) == (char *)0x0) {
LAB_00240be9:
        __assert_fail("b != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x52,"int cmp(const unsigned char *, const unsigned char *)");
      }
      iVar4 = strcmp((char *)puVar2,*(char **)((long)ppuVar12 + lVar9));
      if (iVar4 != 0) {
        __assert_fail("cmp(*from0, *from1)==0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x664,
                      "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = true]"
                     );
      }
      if (local_88 == 0) {
        pcVar10 = "n0";
      }
      else {
        if (n1 != 0) {
          *(lcp_t *)((long)plVar11 + lVar9) = local_98;
          *(lcp_t *)((long)plVar11 + lVar9 + 8) = local_70;
          *(uchar **)((long)local_38 + lVar9) = puVar2;
          *(undefined8 *)((long)local_38 + lVar9 + 8) = *(undefined8 *)((long)ppuVar12 + lVar9);
          local_70 = *(lcp_t *)((long)plVar7 + lVar9);
          local_88 = local_88 - 1;
          if (local_88 == 0) {
            local_80 = (lcp_t *)(n1 - 1);
            local_60 = (uchar **)((long)local_38 + lVar9 + 0x10);
            plVar11 = (lcp_t *)((long)plVar11 + lVar9 + 0x10);
            lVar9 = lVar9 + 8;
            goto LAB_00240a7f;
          }
          __dest = (uchar **)((long)local_38 + lVar9 + 0x10);
          local_98 = *local_a0;
          local_a0 = local_a0 + 1;
          local_78 = local_78 + 1;
          bVar13 = n1 == 1;
          lcp_input1 = (lcp_t *)((long)plVar7 + lVar9 + 8);
          n1 = n1 - 1;
          lcp_result = (lcp_t *)((long)plVar11 + lVar9 + 0x10);
          from1 = (uchar **)((long)ppuVar12 + lVar9 + 8);
          lVar3 = local_98;
          if (bVar13) {
            __dest = (uchar **)((long)local_38 + lVar9 + 0x10);
            local_80 = (lcp_t *)((long)plVar11 + lVar9 + 0x10);
            goto LAB_0024098d;
          }
          goto LAB_00240419;
        }
        pcVar10 = "n1";
      }
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x665,
                    "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = true]"
                   );
    }
    *(undefined8 *)((long)__dest + lVar9) = *(undefined8 *)((long)ppuVar12 + lVar9);
    *(lcp_t *)((long)plVar11 + lVar9) = local_98;
    if (n1 == 1) {
      __dest = (uchar **)((long)__dest + lVar9 + 8);
      local_80 = (lcp_t *)((long)plVar11 + lVar9 + 8);
      local_98 = local_70;
      goto LAB_0024098d;
    }
    __dest = (uchar **)((long)__dest + lVar9 + 8);
    lcp_input1 = (lcp_t *)((long)plVar7 + lVar9 + 8);
    n1 = n1 - 1;
    lcp_result = (lcp_t *)((long)plVar11 + lVar9 + 8);
    from1 = (uchar **)((long)ppuVar12 + lVar9 + 8);
    lVar3 = local_70;
    local_70 = lcp_input1[-1];
  } while( true );
LAB_00240a79:
  local_60 = local_60 + 1;
  plVar11 = plVar8 + 1;
  local_80 = (lcp_t *)n1;
LAB_00240a7f:
  local_a0 = (lcp_t *)((long)plVar7 + lVar9);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  local_48 = '~';
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_48,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"merge_lcp_2way_unstable",0x17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(): n0=",7);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", n1=",5);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  local_48 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_48,1);
  if (local_80 == (lcp_t *)0x0) {
    return;
  }
  sVar6 = (long)local_80 << 3;
  memmove(local_60,(void *)((long)ppuVar12 + lVar9),sVar6);
  *plVar11 = local_70;
LAB_00240a56:
  memmove(plVar11 + 1,local_a0,sVar6);
  return;
}

Assistant:

static void
merge_lcp_2way_unstable(
               unsigned char** from0,  lcp_t* restrict lcp_input0, size_t n0,
               unsigned char** from1,  lcp_t* restrict lcp_input1, size_t n1,
               unsigned char** result, lcp_t* restrict lcp_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	check_input(from0, lcp_input0, n0);
	check_input(from1, lcp_input1, n1);
	lcp_t lcp0=0, lcp1=0;
	int cmp01; lcp_t lcp01;
	std::tie(cmp01, lcp01) = compare(*from0, *from1);
	if (cmp01 <= 0) {
		*result++ = *from0++;
		lcp0 = *lcp_input0++;
		lcp1 = lcp01;
		if (--n0 == 0) goto finish0;
	} else {
		*result++ = *from1++;
		lcp1 = *lcp_input1++;
		lcp0 = lcp01;
		if (--n1 == 0) goto finish1;
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
		        << "\tprev  = '" <<*(result-1)<<"'\n"
		        << "\tfrom0 = '"<<*from0<<"'\n"
		        << "\tfrom1 = '"<<*from1<<"'\n"
		        << "\tlcp0  = " << lcp0 << "\n"
		        << "\tlcp1  = " << lcp1 << "\n"
		        << "\n";
		check_lcps(*(result-1),*from0,lcp0,*from1,lcp1);
		if (lcp0 > lcp1) {
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			lcp0 = *lcp_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			lcp1 = *lcp_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			int cmp01; lcp_t lcp01;
			std::tie(cmp01,lcp01) = compare(*from0, *from1, lcp0);
			if (cmp01 < 0) {
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				lcp1 = lcp01;
				if (--n0 == 0) goto finish0;
				lcp0 = *lcp_input0++;
			} else if (cmp01 == 0) {
				assert(cmp(*from0, *from1)==0);
				assert(n0); assert(n1);
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *lcp_result++ = lcp01;
				*result++ = *from0++;
				*result++ = *from1++;
				--n0;
				--n1;
				lcp0 = *lcp_input0++;
				lcp1 = *lcp_input1++;
				if (n0 == 0) goto finish0;
				if (n1 == 0) goto finish1;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp0;
				lcp0 = lcp01;
				if (--n1 == 0) goto finish1;
				lcp1 = *lcp_input1++;
			}
		}
	}
finish0:
	debug() << '~' << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	assert(not n0);
	if (n1) {
		std::copy(from1, from1+n1, result);
		if (OutputLCP) *lcp_result++ = lcp1;
		if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	}
	return;
finish1:
	debug() << '~' << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	assert(not n1);
	if (n0) {
		std::copy(from0, from0+n0, result);
		if (OutputLCP) *lcp_result++ = lcp0;
		if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	}
	return;
}